

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear-algebra.cc
# Opt level: O2

point3f tinyusdz::geometric_normal(point3f *p0,point3f *p1,point3f *p2)

{
  point3f pVar1;
  point3f local_48;
  point3f local_38;
  point3f local_28;
  
  local_38 = operator-(p1,p0);
  local_48 = operator-(p2,p0);
  local_28 = vcross(&local_38,&local_48);
  pVar1 = vnormalize(&local_28,1.1920929e-07);
  return pVar1;
}

Assistant:

value::point3f geometric_normal(const value::point3f &p0, const value::point3f &p1, const value::point3f &p2)
{
  value::point3f n = vcross(p1 - p0, p2 - p0);

  return vnormalize(n);
}